

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.cpp
# Opt level: O1

double __thiscall entropy::calcEntropy(entropy *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double __x;
  
  iVar1 = this->n;
  dVar6 = log((double)iVar1);
  dVar6 = dVar6 * (double)iVar1;
  if (0 < this->position_box_count) {
    lVar3 = 0;
    do {
      if (0 < this->position_box_count) {
        lVar2 = 0;
        do {
          if (0 < this->velocity_box_count) {
            lVar4 = 0;
            do {
              if (0 < this->velocity_box_count) {
                lVar5 = 0;
                do {
                  iVar1 = *(int *)(*(long *)(*(long *)(*(long *)&(this->boxes).
                                                                                                                                  
                                                  super__Vector_base<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar3].
                                                  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                                  ._M_impl + lVar2 * 0x18) + lVar4 * 0x18) +
                                  lVar5 * 4);
                  if (0 < iVar1) {
                    __x = (double)iVar1;
                    dVar7 = log(__x);
                    dVar6 = dVar6 - dVar7 * __x;
                  }
                  lVar5 = lVar5 + 1;
                } while (lVar5 < this->velocity_box_count);
              }
              lVar4 = lVar4 + 1;
            } while (lVar4 < this->velocity_box_count);
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 < this->position_box_count);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->position_box_count);
  }
  return dVar6;
}

Assistant:

double entropy::calcEntropy()
{
    //int n = particles.size();
    int ns = 0;
    double res = n * log(n);
    for (int i = 0; i < position_box_count; i++)
    {
        for (int j = 0; j < position_box_count; j++)
        {
            for (int k = 0; k < velocity_box_count; k++)
            {
                for (int l = 0; l < velocity_box_count; l++)
                {
                    ns = boxes[i][j][k][l];
                    if (ns > 0)
                    {
                        res -= ns * log(ns);
                    }
                }
            }
        }
    }
    return res;
}